

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_address.cpp
# Opt level: O3

void __thiscall
cfdcapi_address_CfdGetAddressInfoTest_Test::TestBody
          (cfdcapi_address_CfdGetAddressInfoTest_Test *this)

{
  bool bVar1;
  long lVar2;
  AssertHelper address;
  char *pcVar3;
  char *in_R9;
  int *lhs;
  AssertionResult gtest_ar_;
  char *message;
  char *locking_script;
  int ret;
  char *hash;
  int witness_version;
  int hash_type;
  int network;
  void *handle;
  CfdGetAddressExpectData exp_datas [14];
  Message local_2c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  AssertHelper local_2a8;
  int local_29c;
  AssertHelper local_298;
  AssertHelper local_290;
  int local_284 [3];
  void *local_278;
  AssertHelper local_270;
  string local_268;
  int local_248 [134];
  
  local_278 = (void *)0x0;
  local_29c = CfdCreateHandle(&local_278);
  local_2c0.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_268,"kCfdSuccess","ret",(CfdErrorCode *)&local_2c0,&local_29c);
  if ((char)local_268._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_2c0);
    if ((undefined8 *)local_268._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_268._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x230,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    if (CONCAT44(local_2c0.ss_.ptr_._4_4_,local_2c0.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_2c0.ss_.ptr_._4_4_,local_2c0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_2c0.ss_.ptr_._4_4_,local_2c0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_268._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2c0.ss_.ptr_._0_4_ = CONCAT31(local_2c0.ss_.ptr_._1_3_,local_278 != (void *)0x0);
  local_2b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_278 == (void *)0x0) {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_268,(internal *)&local_2c0,(AssertionResult *)"(NULL == handle)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x231,(char *)CONCAT71(local_268._M_dataplus._M_p._1_7_,
                                       (char)local_268._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_268._M_dataplus._M_p._1_7_,(char)local_268._M_dataplus._M_p) !=
        &local_268.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_268._M_dataplus._M_p._1_7_,(char)local_268._M_dataplus._M_p),
                      local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_2a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  memcpy(&local_268,&PTR_anon_var_dwarf_3932a9_00872ec0,0x230);
  lVar2 = 0xe;
  lhs = local_248;
  do {
    local_284[2] = 0;
    local_284[1] = 0;
    local_284[0] = 0;
    local_2a8.data_ = (AssertHelperData *)0x0;
    local_298.data_ = (AssertHelperData *)0x0;
    local_29c = CfdGetAddressInfo(local_278,*(char **)(lhs + -8),local_284 + 2,local_284 + 1,
                                  local_284,(char **)&local_2a8,(char **)&local_298);
    local_2b0.ptr_ = local_2b0.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_2c0,"kCfdSuccess","ret",(CfdErrorCode *)&local_2b0,&local_29c);
    if (local_2c0.ss_.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_2b0);
      pcVar3 = "";
      if (local_2b8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                 ,0x2ba,pcVar3);
      testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2b0);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      if (local_2b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_2b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_2b0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_29c == 0) {
      local_2b0.ptr_ = local_2b0.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_2c0,"kCfdSuccess","ret",(CfdErrorCode *)&local_2b0,&local_29c);
      if (local_2c0.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2b0);
        pcVar3 = "";
        if (local_2b8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_290,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,700,pcVar3);
        testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_290);
        if (local_2b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_2b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_2b0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_2c0,"exp_datas[idx].network","network",lhs + -2,local_284 + 2);
      if (local_2c0.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2b0);
        pcVar3 = "";
        if (local_2b8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_290,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2bd,pcVar3);
        testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_290);
        if (local_2b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_2b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_2b0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_2c0,"exp_datas[idx].hash_type","hash_type",lhs + -1,
                 local_284 + 1);
      if (local_2c0.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2b0);
        pcVar3 = "";
        if (local_2b8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_290,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2be,pcVar3);
        testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_290);
        if (local_2b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_2b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_2b0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_2c0,"exp_datas[idx].witness_version","witness_version",lhs,
                 local_284);
      if (local_2c0.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2b0);
        pcVar3 = "";
        if (local_2b8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_290,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2bf,pcVar3);
        testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_290);
        if (local_2b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_2b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_2b0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2c0,"exp_datas[idx].locking_script","locking_script",
                 *(char **)(lhs + -6),(char *)local_2a8.data_);
      if (local_2c0.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2b0);
        pcVar3 = "";
        if (local_2b8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_290,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2c0,pcVar3);
        testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_290);
        if (local_2b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_2b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_2b0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2c0,"exp_datas[idx].hash","hash",*(char **)(lhs + -4),
                 (char *)local_298.data_);
      if (local_2c0.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2b0);
        pcVar3 = "";
        if (local_2b8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_290,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2c1,pcVar3);
        testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_290);
        if (local_2b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_2b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_2b0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_2a8.data_);
      address.data_ = local_298.data_;
LAB_00283b92:
      CfdFreeStringBuffer((char *)address.data_);
    }
    else {
      local_2b0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_29c = CfdGetLastErrorMessage(local_278,(char **)&local_2b0);
      if (local_29c == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_2c0,"\"\"","message","",(char *)local_2b0.ptr_);
        if (local_2c0.ss_.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_290);
          pcVar3 = "";
          if (local_2b8.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_270,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                     ,0x2c8,pcVar3);
          testing::internal::AssertHelper::operator=(&local_270,(Message *)&local_290);
          testing::internal::AssertHelper::~AssertHelper(&local_270);
          if (local_290.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_290.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_290.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        address.data_ = (AssertHelperData *)local_2b0.ptr_;
        goto LAB_00283b92;
      }
    }
    lhs = lhs + 10;
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      local_29c = CfdFreeHandle(local_278);
      local_2a8.data_ = local_2a8.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_2c0,"kCfdSuccess","ret",(CfdErrorCode *)&local_2a8,&local_29c);
      if (local_2c0.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2a8);
        if (local_2b8.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_298,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2cf,pcVar3);
        testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2a8);
        testing::internal::AssertHelper::~AssertHelper(&local_298);
        if (local_2a8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_2a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_2a8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
  } while( true );
}

Assistant:

TEST(cfdcapi_address, CfdGetAddressInfoTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdGetAddressExpectData {
    const char* address;
    const char* locking_script;
    const char* hash;
    int network;
    int hash_type;
    int witness_version;
  };
  const struct CfdGetAddressExpectData exp_datas[] = {
    { // HashType(P2PKH) mainnet
      "1PMycacnJaSqwwJqjawXBErnLsZ7RkXUAs",
      "76a914f54a5851e9372b87810a8e60cdd2e7cfd80b6e3188ac",
      "f54a5851e9372b87810a8e60cdd2e7cfd80b6e31",
      kCfdNetworkMainnet,
      kCfdP2pkh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2PKH) testnet
      "mjawtDFWiNppWUqczgQevgyg6Hg7J8Uxcg",
      "76a9142ca1d2e7214b16725cf6310867460633a061edcb88ac",
      "2ca1d2e7214b16725cf6310867460633a061edcb",
      kCfdNetworkTestnet,
      kCfdP2pkh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2SH) mainnet
      "3KxE77EHe1ip6WGRifwr9fZ5WBDGsLyWFz",
      "a914c852ac34a1c76b63a279c97502c9ccc4e3cb9e8b87",
      "c852ac34a1c76b63a279c97502c9ccc4e3cb9e8b",
      kCfdNetworkMainnet,
      kCfdP2sh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2SH) testnet
      "2NEbifo1SsiCYMQhGxGCg3tcTzR8xHuhqeH",
      "a914ea3ae70e53e6e2813002738cba26bd0cfcdecb0687",
      "ea3ae70e53e6e2813002738cba26bd0cfcdecb06",
      kCfdNetworkTestnet,
      kCfdP2sh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2SH-P2WPKH) mainnet
      "3JvL6Ymt8MVWiCNHC7oWU6nLeHNJKLZGLN",
      "a914bcfeb728b584253d5f3f70bcb780e9ef218a68f487",
      "bcfeb728b584253d5f3f70bcb780e9ef218a68f4",
      kCfdNetworkMainnet,
      kCfdP2sh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2WPKH) mainnet
      "bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",
      "0014751e76e8199196d454941c45d1b3a323f1433bd6",
      "751e76e8199196d454941c45d1b3a323f1433bd6",
      kCfdNetworkMainnet,
      kCfdP2wpkh,
      kCfdWitnessVersion0,
    },
    { // HashType(P2WPKH) testnet
      "tb1qw508d6qejxtdg4y5r3zarvary0c5xw7kxpjzsx",
      "0014751e76e8199196d454941c45d1b3a323f1433bd6",
      "751e76e8199196d454941c45d1b3a323f1433bd6",
      kCfdNetworkTestnet,
      kCfdP2wpkh,
      kCfdWitnessVersion0,
    },
    { // HashType(P2WSH) mainnet
      "bc1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3qccfmv3",
      "00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262",
      "1863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262",
      kCfdNetworkMainnet,
      kCfdP2wsh,
      kCfdWitnessVersion0,
    },
    { // HashType(P2WSH) testnet
      "tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7",
      "00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262",
      "1863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262",
      kCfdNetworkTestnet,
      kCfdP2wsh,
      kCfdWitnessVersion0,
    },
    { // HashType(Taproot) mainnet
      "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4",
      "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      kCfdNetworkMainnet,
      kCfdTaproot,
      kCfdWitnessVersion1,
    },
#ifndef CFD_DISABLE_ELEMENTS
    { // Elements HashType(P2PKH) liquidv1
      "QKXGAM4Cvd1fvLEz5tbq4YwNRzTjdMWi2q",
      "76a914f42331c418ef4517ba644ad6e9fc99681ad4393788ac",
      "f42331c418ef4517ba644ad6e9fc99681ad43937",
      kCfdNetworkLiquidv1,
      kCfdP2pkh,
      kCfdWitnessVersionNone,
    },
    { // Elements HashType(P2SH) regtest
      "XRpicZNrFZumBMhRV5BSYW28pGX7JyY1ua",
      "a9149ec42b6cfa1b0bc3f55f07af29867057cb0b8a2e87",
      "9ec42b6cfa1b0bc3f55f07af29867057cb0b8a2e",
      kCfdNetworkElementsRegtest,
      kCfdP2sh,
      kCfdWitnessVersionNone,
    },
    { // Elements HashType(P2WPKH) regtest
      "ert1q57etrknhl75e64jmqrvl0vwzu39xjpagaw9ynw",
      "0014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a8",
      "a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a8",
      kCfdNetworkElementsRegtest,
      kCfdP2wpkh,
      kCfdWitnessVersion0,
    },
    { // Elements HashType(P2WSH) liquidv1
      "ex1q6tayh53l97qhs7fr98x8msgmn82egptfhpkyn53vkt22lrxswztsgnpmxp",
      "0020d2fa4bd23f2f8178792329cc7dc11b99d5940569b86c49d22cb2d4af8cd07097",
      "d2fa4bd23f2f8178792329cc7dc11b99d5940569b86c49d22cb2d4af8cd07097",
      kCfdNetworkLiquidv1,
      kCfdP2wsh,
      kCfdWitnessVersion0,
    },
#endif  // CFD_DISABLE_ELEMENTS
  };
  size_t list_size = sizeof(exp_datas) / sizeof(struct CfdGetAddressExpectData);

  for (size_t idx = 0; idx < list_size; ++idx) {
    int network = 0;
    int hash_type = 0;
    int witness_version = 0;
    char* locking_script = nullptr;
    char* hash = nullptr;
    ret = CfdGetAddressInfo(
        handle, exp_datas[idx].address, &network, &hash_type,
        &witness_version, &locking_script, &hash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(exp_datas[idx].network, network);
      EXPECT_EQ(exp_datas[idx].hash_type, hash_type);
      EXPECT_EQ(exp_datas[idx].witness_version, witness_version);
      EXPECT_STREQ(exp_datas[idx].locking_script, locking_script);
      EXPECT_STREQ(exp_datas[idx].hash, hash);
      CfdFreeStringBuffer(locking_script);
      CfdFreeStringBuffer(hash);
    } else {
      char* message = nullptr;
      ret = CfdGetLastErrorMessage(handle, &message);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("", message);
        CfdFreeStringBuffer(message);
      }
    }
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}